

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::initSamplerShader
          (LayeredRenderCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLint GVar5;
  TestLog *pTVar6;
  ShaderProgram *this_00;
  RenderContext *pRVar7;
  RenderContext *pRVar8;
  ProgramSources *pPVar9;
  TestError *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_279;
  string local_278;
  undefined1 local_252;
  allocator<char> local_251;
  string local_250;
  undefined1 local_22a;
  allocator<char> local_229;
  string local_228;
  undefined1 local_205;
  ContextType local_204;
  string local_200;
  ShaderSource local_1e0;
  ContextType local_1b8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  ShaderSource local_170;
  ProgramSources local_148;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ScopedLogSection local_18;
  ScopedLogSection section;
  LayeredRenderCase *this_local;
  
  section.m_log = (TestLog *)this;
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TextureSamplerShader",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Create shader sampler program",&local_71);
  tcu::ScopedLogSection::ScopedLogSection(&local_18,pTVar6,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_205 = 1;
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_1b1);
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_1b8.super_ApiType.m_bits = (ApiType)(*pRVar8->_vptr_RenderContext[2])();
  specializeShader(&local_190,&local_1b0,&local_1b8);
  glu::VertexSource::VertexSource((VertexSource *)&local_170,&local_190);
  pPVar9 = glu::ProgramSources::operator<<(&local_148,&local_170);
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_204.super_ApiType.m_bits = (ApiType)(*pRVar8->_vptr_RenderContext[2])();
  Functional::(anonymous_namespace)::LayeredRenderCase::genSamplerFragmentSource_abi_cxx11_
            (&local_200,this,&local_204);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1e0,&local_200);
  pPVar9 = glu::ProgramSources::operator<<(pPVar9,&local_1e0);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar7,pPVar9);
  local_205 = 0;
  this->m_samplerShader = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  glu::VertexSource::~VertexSource((VertexSource *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  glu::ProgramSources::~ProgramSources(&local_148);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar6,this->m_samplerShader);
  bVar2 = glu::ShaderProgram::isOk(this->m_samplerShader);
  if (!bVar2) {
    local_22a = 1;
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"failed to build sampler shader",&local_229);
    tcu::TestError::TestError(pTVar10,&local_228);
    local_22a = 0;
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0xb48);
  dVar4 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  GVar5 = (*pcVar1)(dVar4,"u_sampler");
  this->m_samplerSamplerLoc = GVar5;
  if (this->m_samplerSamplerLoc == -1) {
    local_252 = 1;
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"u_sampler uniform location = -1",&local_251);
    tcu::TestError::TestError(pTVar10,&local_250);
    local_252 = 0;
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var_00,iVar3) + 0xb48);
  dVar4 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  GVar5 = (*pcVar1)(dVar4,"u_layer");
  this->m_samplerLayerLoc = GVar5;
  if (this->m_samplerLayerLoc == -1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"u_layer uniform location = -1",&local_279);
    tcu::TestError::TestError(pTVar10,&local_278);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_18);
  return;
}

Assistant:

void LayeredRenderCase::initSamplerShader (void)
{
	const tcu::ScopedLogSection section(m_testCtx.getLog(), "TextureSamplerShader", "Create shader sampler program");

	static const char* const positionVertex =	"${GLSL_VERSION_DECL}\n"
												"in highp vec4 a_position;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"}\n";

	m_samplerShader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
																			<< glu::VertexSource(specializeShader(positionVertex, m_context.getRenderContext().getType()))
																			<< glu::FragmentSource(genSamplerFragmentSource(m_context.getRenderContext().getType())));

	m_testCtx.getLog() << *m_samplerShader;

	if (!m_samplerShader->isOk())
		throw tcu::TestError("failed to build sampler shader");

	m_samplerSamplerLoc = m_context.getRenderContext().getFunctions().getUniformLocation(m_samplerShader->getProgram(), "u_sampler");
	if (m_samplerSamplerLoc == -1)
		throw tcu::TestError("u_sampler uniform location = -1");

	m_samplerLayerLoc = m_context.getRenderContext().getFunctions().getUniformLocation(m_samplerShader->getProgram(), "u_layer");
	if (m_samplerLayerLoc == -1)
		throw tcu::TestError("u_layer uniform location = -1");
}